

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto.cc
# Opt level: O0

bool absl::lts_20240722::log_internal::Encode32Bit(uint64_t tag,uint32_t value,Span<char> *buf)

{
  uint64_t value_00;
  size_t size;
  size_type sVar1;
  reference pcVar2;
  undefined8 local_40;
  size_t s;
  size_t tag_type_size;
  uint64_t tag_type;
  Span<char> *buf_local;
  uint32_t value_local;
  uint64_t tag_local;
  
  value_00 = anon_unknown_2::MakeTagType(tag,k32Bit);
  size = VarintSize(value_00);
  sVar1 = Span<char>::size(buf);
  if (sVar1 < size + 4) {
    sVar1 = Span<char>::size(buf);
    Span<char>::remove_suffix(buf,sVar1);
    tag_local._7_1_ = false;
  }
  else {
    anon_unknown_2::EncodeRawVarint(value_00,size,buf);
    buf_local._4_4_ = value;
    for (local_40 = 0; local_40 < 4; local_40 = local_40 + 1) {
      pcVar2 = Span<char>::operator[](buf,local_40);
      *pcVar2 = (char)buf_local._4_4_;
      buf_local._4_4_ = buf_local._4_4_ >> 8;
    }
    Span<char>::remove_prefix(buf,4);
    tag_local._7_1_ = true;
  }
  return tag_local._7_1_;
}

Assistant:

bool Encode32Bit(uint64_t tag, uint32_t value, absl::Span<char> *buf) {
  const uint64_t tag_type = MakeTagType(tag, WireType::k32Bit);
  const size_t tag_type_size = VarintSize(tag_type);
  if (tag_type_size + sizeof(value) > buf->size()) {
    buf->remove_suffix(buf->size());
    return false;
  }
  EncodeRawVarint(tag_type, tag_type_size, buf);
  for (size_t s = 0; s < sizeof(value); s++) {
    (*buf)[s] = static_cast<char>(value & 0xff);
    value >>= 8;
  }
  buf->remove_prefix(sizeof(value));
  return true;
}